

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cpp
# Opt level: O0

ScalarFunction * duckdb::RandomFun::GetFunction(void)

{
  ScalarFunction *in_RDI;
  ScalarFunction *random;
  _func_void_DataChunk_ptr_ExpressionState_ptr_Vector_ptr *in_stack_ffffffffffffff08;
  function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
  *in_stack_ffffffffffffff10;
  LogicalType local_b8 [24];
  undefined1 local_a0 [32];
  LogicalType local_80 [24];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  allocator local_31;
  string local_30 [39];
  undefined1 local_9;
  
  local_9 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"random",&local_31);
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  vector<duckdb::LogicalType,_true>::vector((vector<duckdb::LogicalType,_true> *)0xe8b695);
  duckdb::LogicalType::LogicalType(local_80,DOUBLE);
  std::function<void(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)>::
  function<void(&)(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&),void>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  duckdb::LogicalType::LogicalType(local_b8,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (in_RDI,local_30,&local_68,local_80,local_a0,0,0,0,RandomInitLocalState,local_b8,0,0,0);
  duckdb::LogicalType::~LogicalType(local_b8);
  std::function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>::~function
            ((function<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)> *)
             0xe8b746);
  duckdb::LogicalType::~LogicalType(local_80);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0xe8b760);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  in_RDI->field_0xa8 = 1;
  return in_RDI;
}

Assistant:

ScalarFunction RandomFun::GetFunction() {
	ScalarFunction random("random", {}, LogicalType::DOUBLE, RandomFunction, nullptr, nullptr, nullptr,
	                      RandomInitLocalState);
	random.stability = FunctionStability::VOLATILE;
	return random;
}